

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O0

int32_t __thiscall icu_63::RegexCompile::blockTopLoc(RegexCompile *this,UBool reserveLoc)

{
  int32_t iVar1;
  int64_t iVar2;
  int32_t nop;
  int32_t opAtTheLoc;
  int32_t theLoc;
  UBool reserveLoc_local;
  RegexCompile *this_local;
  
  fixLiterals(this,'\x01');
  iVar1 = UVector64::size(this->fRXPat->fCompiledPat);
  if (iVar1 == this->fMatchCloseParen) {
    nop = this->fMatchOpenParen;
  }
  else {
    iVar1 = UVector64::size(this->fRXPat->fCompiledPat);
    nop = iVar1 + -1;
    iVar2 = UVector64::elementAti(this->fRXPat->fCompiledPat,nop);
    if ((uint)iVar2 >> 0x18 == 5) {
      nop = iVar1 + -2;
    }
    if (reserveLoc != '\0') {
      iVar1 = buildOp(this,7,0);
      UVector64::insertElementAt(this->fRXPat->fCompiledPat,(long)iVar1,nop,this->fStatus);
    }
  }
  return nop;
}

Assistant:

int32_t   RegexCompile::blockTopLoc(UBool reserveLoc) {
    int32_t   theLoc;
    fixLiterals(TRUE);  // Emit code for any pending literals.
                        //   If last item was a string, emit separate op for the its last char.
    if (fRXPat->fCompiledPat->size() == fMatchCloseParen)
    {
        // The item just processed is a parenthesized block.
        theLoc = fMatchOpenParen;   // A slot is already reserved for us.
        U_ASSERT(theLoc > 0);
        U_ASSERT(URX_TYPE(((uint32_t)fRXPat->fCompiledPat->elementAti(theLoc))) == URX_NOP);
    }
    else {
        // Item just compiled is a single thing, a ".", or a single char, a string or a set reference.
        // No slot for STATE_SAVE was pre-reserved in the compiled code.
        // We need to make space now.
        theLoc = fRXPat->fCompiledPat->size()-1;
        int32_t opAtTheLoc = (int32_t)fRXPat->fCompiledPat->elementAti(theLoc);
        if (URX_TYPE(opAtTheLoc) == URX_STRING_LEN) {
            // Strings take two opcode, we want the position of the first one.
            // We can have a string at this point if a single character case-folded to two.
            theLoc--;
        }
        if (reserveLoc) {
            int32_t  nop = buildOp(URX_NOP, 0);
            fRXPat->fCompiledPat->insertElementAt(nop, theLoc, *fStatus);
        }
    }
    return theLoc;
}